

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::_::
CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::$_0>
::operator()(CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
             *this,unsigned_long *args)

{
  anon_class_16_2_c1b48c2d_for_value functor;
  byte bVar1;
  unsigned_long *in_RDX;
  anon_class_16_2_c1b48c2d_for_value *paVar2;
  bool bVar3;
  
  bVar1 = (byte)*args;
  if (bVar1 == 0) {
    throwMultipleCoCaptureInvocations();
    bVar1 = (byte)*args;
  }
  bVar3 = (bVar1 & 1) != 0;
  paVar2 = (anon_class_16_2_c1b48c2d_for_value *)0x0;
  if (bVar3) {
    paVar2 = (anon_class_16_2_c1b48c2d_for_value *)(args + 1);
  }
  functor = *paVar2;
  if (bVar3) {
    *(undefined1 *)args = 0;
  }
  CaptureForCoroutine<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:544:10)>
  ::coInvoke<unsigned_long>
            ((CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
              *)this,functor,in_RDX);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

auto operator()(Args&&... args) {
    if (maybeFunctor == kj::none) {
      throwMultipleCoCaptureInvocations();
    }
    auto localFunctor = kj::mv(*kj::_::readMaybe(maybeFunctor));
    maybeFunctor = kj::none;
    return coInvoke(kj::mv(localFunctor), kj::fwd<Args>(args)...);
  }